

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_data.cpp
# Opt level: O2

void __thiscall duckdb::ErrorData::ErrorData(ErrorData *this,exception *ex)

{
  char *pcVar1;
  allocator local_31;
  string local_30;
  
  pcVar1 = (char *)(**(code **)(*(long *)ex + 0x10))(ex);
  ::std::__cxx11::string::string((string *)&local_30,pcVar1,&local_31);
  ErrorData(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

ErrorData::ErrorData(const std::exception &ex) : ErrorData(ex.what()) {
}